

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_copy(lua_State *L,int fromidx,int toidx)

{
  ushort uVar1;
  int iVar2;
  GCObject *pGVar3;
  StkId pTVar4;
  int *piVar5;
  TValue *pTVar6;
  TValue *pTVar7;
  char *__assertion;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xe5,"void lua_copy(lua_State *, int, int)");
  }
  pTVar6 = index2addr(L,fromidx);
  pTVar7 = index2addr(L,toidx);
  if (pTVar7 == &luaO_nilobject_) {
    __assert_fail("(((to) != (&luaO_nilobject_))) && \"invalid index\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xe8,"void lua_copy(lua_State *, int, int)");
  }
  pGVar3 = (pTVar6->value_).gc;
  (pTVar7->value_).gc = pGVar3;
  uVar1 = pTVar6->tt_;
  pTVar7->tt_ = uVar1;
  if ((short)uVar1 < 0) {
    if (((uVar1 & 0x7f) != (ushort)pGVar3->tt) ||
       ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xe9,"void lua_copy(lua_State *, int, int)");
    }
    if (toidx < -0xf4628) {
      pTVar4 = L->ci->func;
      if (pTVar4->tt_ == 0x8026) {
        pGVar3 = (pTVar4->value_).gc;
        if (pGVar3->tt == '&') {
          if (((pGVar3->marked & 0x20) != 0) && ((((pTVar6->value_).gc)->marked & 0x18) != 0)) {
            luaC_barrier_(L,pGVar3,(pTVar6->value_).gc);
          }
          goto LAB_0010b0ec;
        }
        __assertion = "(((L->ci->func)->value_).gc)->tt == ((6) | ((2) << 4))";
      }
      else {
        __assertion = "((((L->ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xeb,"void lua_copy(lua_State *, int, int)");
    }
  }
LAB_0010b0ec:
  piVar5 = *(int **)&L[-1].hookmask;
  *piVar5 = *piVar5 + -1;
  if (*piVar5 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0xee,"void lua_copy(lua_State *, int, int)");
}

Assistant:

LUA_API void lua_copy (lua_State *L, int fromidx, int toidx) {
  TValue *fr, *to;
  lua_lock(L);
  fr = index2addr(L, fromidx);
  to = index2addr(L, toidx);
  api_checkvalidindex(L, to);
  setobj(L, to, fr);
  if (isupvalue(toidx))  /* function upvalue? */
    luaC_barrier(L, clCvalue(L->ci->func), fr);
  /* LUA_REGISTRYINDEX does not need gc barrier
     (collector revisits it before finishing collection) */
  lua_unlock(L);
}